

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

aiMesh * __thiscall
Assimp::ColladaLoader::CreateMesh
          (ColladaLoader *this,ColladaParser *pParser,Mesh *pSrcMesh,SubMesh *pSubMesh,
          Controller *pSrcController,size_t pStartVertex,size_t pStartFace)

{
  allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *this_00;
  uint uVar1;
  pointer ppaVar2;
  value_type paVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  size_t sVar14;
  bool bVar15;
  __type _Var16;
  aiMesh *paVar17;
  pointer paVar18;
  ulong uVar19;
  aiVector3D *paVar20;
  size_type sVar21;
  const_reference pvVar22;
  aiColor4D *paVar23;
  ulong *puVar24;
  const_reference pvVar25;
  ulong uVar26;
  uint *puVar27;
  pointer ppVar28;
  Mesh **ppMVar29;
  const_reference pURL;
  const_reference pSubMesh_00;
  const_reference __x;
  size_type sVar30;
  reference ppaVar31;
  reference pvVar32;
  aiAnimMesh **ppaVar33;
  reference ppaVar34;
  DeadlyImportError *pDVar35;
  pointer __n;
  reference pvVar36;
  pointer ppVar37;
  reference pvVar38;
  pointer this_01;
  aiBone **ppaVar39;
  aiBone *this_02;
  string *pString;
  aiVertexWeight *paVar40;
  iterator __first;
  Node *pNVar41;
  Logger *this_03;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *this_04;
  basic_formatter *this_05;
  aiFace *paVar42;
  ai_real aVar43;
  aiVertexWeight *local_a70;
  float local_93c;
  aiFace *local_840;
  aiColor4t<float> *local_7f8;
  aiVector3t<float> *local_7c0;
  aiVector3t<float> *local_790;
  aiVector3t<float> *local_760;
  aiVector3t<float> *local_730;
  aiVector3t<float> *local_700;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  string local_540;
  string local_520;
  allocator<char> local_4f9;
  string local_4f8;
  allocator<char> local_4d1;
  string local_4d0;
  Node *local_4b0;
  Node *bnode;
  aiMatrix4x4 bindShapeMatrix;
  aiBone *bone;
  size_t a_5;
  size_t boneCount;
  __normal_iterator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_*,_std::vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_438;
  __normal_iterator<const_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_*,_std::vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
  local_430;
  const_iterator it_1;
  size_t numRemainingBones;
  uint local_418;
  aiVertexWeight w;
  ai_real weight_1;
  size_t vertexIndex;
  size_t jointIndex;
  size_t b_2;
  size_t pairCount;
  const_iterator iit;
  size_t orgIndex;
  size_t a_4;
  size_t a_3;
  const_iterator pit;
  undefined1 local_3c0 [8];
  vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
  weightStartPerVertex;
  undefined1 local_3a0 [8];
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  dstBones;
  size_t numBones;
  string local_378;
  undefined1 local_352;
  allocator<char> local_351;
  string local_350;
  Data *local_330;
  Data *weights;
  Accessor *weightsAcc;
  string local_318;
  Accessor *local_2f8;
  Accessor *weightNamesAcc;
  Data *jointMatrices;
  Accessor *jointMatrixAcc;
  Data *jointNames;
  Accessor *jointNamesAcc;
  uint i_3;
  float weight;
  aiAnimMesh *animMesh;
  aiMesh *targetMesh_1;
  undefined1 local_2b0 [4];
  uint i_2;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  uint i_1;
  aiMesh *local_270;
  aiMesh *aimesh;
  Mesh *targetMesh;
  uint i;
  undefined1 local_232;
  allocator<char> local_231;
  string local_230;
  Data *local_210;
  Data *weightData;
  Data *targetData;
  Accessor *weightAccessor;
  Accessor *targetAccessor;
  Mesh *baseMesh;
  Controller *c;
  _Self local_1d8;
  const_iterator it;
  undefined1 local_1c8 [4];
  MorphMethod method;
  vector<float,_std::allocator<float>_> targetWeights;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> targetMeshes;
  size_t b_1;
  aiFace *face;
  size_t s;
  size_t a_2;
  size_t vertex;
  __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_168;
  __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_160;
  __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_158;
  __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
  local_150;
  long local_148;
  size_t real_1;
  size_t a_1;
  size_t b;
  size_t real;
  size_t a;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_118;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_110;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_108;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_100;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_f8;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_f0;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_e8;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_e0;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_d8;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_d0;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_c8;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_c0;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_b8;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_b0;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_a8;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_a0;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_98;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_90;
  __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
  local_88;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_80;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78;
  unsigned_long *local_70;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_68;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  ulong local_58;
  size_t numVertices;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> local_40;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> dstMesh;
  size_t pStartVertex_local;
  Controller *pSrcController_local;
  SubMesh *pSubMesh_local;
  Mesh *pSrcMesh_local;
  ColladaParser *pParser_local;
  ColladaLoader *this_local;
  
  dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)pStartVertex;
  paVar17 = (aiMesh *)operator_new(0x520);
  aiMesh::aiMesh(paVar17);
  std::unique_ptr<aiMesh,std::default_delete<aiMesh>>::unique_ptr<std::default_delete<aiMesh>,void>
            ((unique_ptr<aiMesh,std::default_delete<aiMesh>> *)&local_40,paVar17);
  paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
  aiString::operator=(&paVar18->mName,&pSrcMesh->mName);
  local_68._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&pSrcMesh->mFaceSize);
  local_60 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+(&local_68,pStartFace);
  local_80._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&pSrcMesh->mFaceSize);
  local_78 = __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+(&local_80,pStartFace);
  local_70 = (unsigned_long *)
             __gnu_cxx::
             __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+(&local_78,pSubMesh->mNumFaces);
  local_58 = std::
             accumulate<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                       (local_60,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )local_70,0);
  uVar1 = (uint)local_58;
  paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
  uVar26 = local_58;
  paVar18->mNumVertices = uVar1;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_58;
  uVar19 = SUB168(auVar4 * ZEXT816(0xc),0);
  if (SUB168(auVar4 * ZEXT816(0xc),8) != 0) {
    uVar19 = 0xffffffffffffffff;
  }
  paVar20 = (aiVector3D *)operator_new__(uVar19);
  if (uVar26 != 0) {
    local_700 = paVar20;
    do {
      aiVector3t<float>::aiVector3t(local_700);
      local_700 = local_700 + 1;
    } while (local_700 != paVar20 + uVar26);
  }
  paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
  paVar18->mVertices = paVar20;
  local_90._M_current =
       (aiVector3t<float> *)
       std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                 (&pSrcMesh->mPositions);
  local_88 = __gnu_cxx::
             __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
             ::operator+(&local_90,
                         (difference_type)
                         dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                         _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
  local_a8._M_current =
       (aiVector3t<float> *)
       std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                 (&pSrcMesh->mPositions);
  local_a0 = __gnu_cxx::
             __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
             ::operator+(&local_a8,
                         (difference_type)
                         dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                         _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
  local_98 = __gnu_cxx::
             __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
             ::operator+(&local_a0,local_58);
  paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
  std::
  copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
            (local_88,local_98,paVar18->mVertices);
  sVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                     (&pSrcMesh->mNormals);
  uVar26 = local_58;
  if ((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + local_58 <= sVar21) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_58;
    uVar19 = SUB168(auVar5 * ZEXT816(0xc),0);
    if (SUB168(auVar5 * ZEXT816(0xc),8) != 0) {
      uVar19 = 0xffffffffffffffff;
    }
    paVar20 = (aiVector3D *)operator_new__(uVar19);
    if (uVar26 != 0) {
      local_730 = paVar20;
      do {
        aiVector3t<float>::aiVector3t(local_730);
        local_730 = local_730 + 1;
      } while (local_730 != paVar20 + uVar26);
    }
    paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
    paVar18->mNormals = paVar20;
    local_b8._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                   (&pSrcMesh->mNormals);
    local_b0 = __gnu_cxx::
               __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator+(&local_b8,
                           (difference_type)
                           dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                           _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
    local_d0._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                   (&pSrcMesh->mNormals);
    local_c8 = __gnu_cxx::
               __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator+(&local_d0,
                           (difference_type)
                           dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                           _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
    local_c0 = __gnu_cxx::
               __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator+(&local_c8,local_58);
    paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
    std::
    copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
              (local_b0,local_c0,paVar18->mNormals);
  }
  sVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                     (&pSrcMesh->mTangents);
  uVar26 = local_58;
  if ((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + local_58 <= sVar21) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_58;
    uVar19 = SUB168(auVar6 * ZEXT816(0xc),0);
    if (SUB168(auVar6 * ZEXT816(0xc),8) != 0) {
      uVar19 = 0xffffffffffffffff;
    }
    paVar20 = (aiVector3D *)operator_new__(uVar19);
    if (uVar26 != 0) {
      local_760 = paVar20;
      do {
        aiVector3t<float>::aiVector3t(local_760);
        local_760 = local_760 + 1;
      } while (local_760 != paVar20 + uVar26);
    }
    paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
    paVar18->mTangents = paVar20;
    local_e0._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                   (&pSrcMesh->mTangents);
    local_d8 = __gnu_cxx::
               __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator+(&local_e0,
                           (difference_type)
                           dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                           _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
    local_f8._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                   (&pSrcMesh->mTangents);
    local_f0 = __gnu_cxx::
               __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator+(&local_f8,
                           (difference_type)
                           dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                           _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
    local_e8 = __gnu_cxx::
               __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
               ::operator+(&local_f0,local_58);
    paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
    std::
    copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
              (local_d8,local_e8,paVar18->mTangents);
  }
  sVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                     (&pSrcMesh->mBitangents);
  uVar26 = local_58;
  if ((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + local_58 <= sVar21) {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_58;
    uVar19 = SUB168(auVar7 * ZEXT816(0xc),0);
    if (SUB168(auVar7 * ZEXT816(0xc),8) != 0) {
      uVar19 = 0xffffffffffffffff;
    }
    paVar20 = (aiVector3D *)operator_new__(uVar19);
    if (uVar26 != 0) {
      local_790 = paVar20;
      do {
        aiVector3t<float>::aiVector3t(local_790);
        local_790 = local_790 + 1;
      } while (local_790 != paVar20 + uVar26);
    }
    paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
    paVar18->mBitangents = paVar20;
    local_108._M_current =
         (aiVector3t<float> *)
         std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                   (&pSrcMesh->mBitangents);
    local_100 = __gnu_cxx::
                __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                ::operator+(&local_108,
                            (difference_type)
                            dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>
                            ._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
    a = (size_t)std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::begin
                          (&pSrcMesh->mBitangents);
    local_118 = __gnu_cxx::
                __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                ::operator+((__normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                             *)&a,(difference_type)
                                  dstMesh._M_t.
                                  super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
    local_110 = __gnu_cxx::
                __normal_iterator<const_aiVector3t<float>_*,_std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>_>
                ::operator+(&local_118,local_58);
    paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
    std::
    copy<__gnu_cxx::__normal_iterator<aiVector3t<float>const*,std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>>,aiVector3t<float>*>
              (local_100,local_110,paVar18->mBitangents);
  }
  b = 0;
  for (real = 0; real < 8; real = real + 1) {
    sVar21 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size
                       (pSrcMesh->mTexCoords + real);
    uVar26 = local_58;
    if ((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + local_58 <= sVar21) {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_58;
      uVar19 = SUB168(auVar8 * ZEXT816(0xc),0);
      if (SUB168(auVar8 * ZEXT816(0xc),8) != 0) {
        uVar19 = 0xffffffffffffffff;
      }
      paVar20 = (aiVector3D *)operator_new__(uVar19);
      if (uVar26 != 0) {
        local_7c0 = paVar20;
        do {
          aiVector3t<float>::aiVector3t(local_7c0);
          local_7c0 = local_7c0 + 1;
        } while (local_7c0 != paVar20 + uVar26);
      }
      paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
      paVar18->mTextureCoords[b] = paVar20;
      for (a_1 = 0; a_1 < local_58; a_1 = a_1 + 1) {
        pvVar22 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::operator[]
                            (pSrcMesh->mTexCoords + real,
                             (long)dstMesh._M_t.
                                   super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + a_1);
        paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
        paVar20 = paVar18->mTextureCoords[b] + a_1;
        fVar13 = pvVar22->y;
        paVar20->x = pvVar22->x;
        paVar20->y = fVar13;
        paVar20->z = pvVar22->z;
      }
      uVar1 = pSrcMesh->mNumUVComponents[real];
      paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
      paVar18->mNumUVComponents[b] = uVar1;
      b = b + 1;
    }
  }
  local_148 = 0;
  for (real_1 = 0; real_1 < 8; real_1 = real_1 + 1) {
    sVar21 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::size
                       (pSrcMesh->mColors + real_1);
    uVar26 = local_58;
    if ((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + local_58 <= sVar21) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_58;
      uVar19 = SUB168(auVar9 * ZEXT816(0x10),0);
      if (SUB168(auVar9 * ZEXT816(0x10),8) != 0) {
        uVar19 = 0xffffffffffffffff;
      }
      paVar23 = (aiColor4D *)operator_new__(uVar19);
      if (uVar26 != 0) {
        local_7f8 = paVar23;
        do {
          aiColor4t<float>::aiColor4t(local_7f8);
          local_7f8 = local_7f8 + 1;
        } while (local_7f8 != paVar23 + uVar26);
      }
      paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
      paVar18->mColors[local_148] = paVar23;
      local_158._M_current =
           (aiColor4t<float> *)
           std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::begin
                     (pSrcMesh->mColors + real_1);
      local_150 = __gnu_cxx::
                  __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                  ::operator+(&local_158,
                              (difference_type)
                              dstMesh._M_t.
                              super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
      vertex = (size_t)std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::begin
                                 (pSrcMesh->mColors + real_1);
      local_168 = __gnu_cxx::
                  __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                  ::operator+((__normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                               *)&vertex,
                              (difference_type)
                              dstMesh._M_t.
                              super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
      local_160 = __gnu_cxx::
                  __normal_iterator<const_aiColor4t<float>_*,_std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>_>
                  ::operator+(&local_168,local_58);
      paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
      std::
      copy<__gnu_cxx::__normal_iterator<aiColor4t<float>const*,std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>>,aiColor4t<float>*>
                (local_150,local_160,paVar18->mColors[local_148]);
      local_148 = local_148 + 1;
    }
  }
  a_2 = 0;
  sVar14 = pSubMesh->mNumFaces;
  paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
  paVar18->mNumFaces = (uint)sVar14;
  paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
  uVar26 = (ulong)paVar18->mNumFaces;
  puVar24 = (ulong *)operator_new__(uVar26 << 4 | 8);
  *puVar24 = uVar26;
  paVar42 = (aiFace *)(puVar24 + 1);
  if (uVar26 != 0) {
    local_840 = paVar42;
    do {
      aiFace::aiFace(local_840);
      local_840 = local_840 + 1;
    } while (local_840 != paVar42 + uVar26);
  }
  paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
  paVar18->mFaces = paVar42;
  for (s = 0; paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40)
      , s < paVar18->mNumFaces; s = s + 1) {
    pvVar25 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (&pSrcMesh->mFaceSize,pStartFace + s);
    ppaVar2 = (pointer)*pvVar25;
    paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
    paVar42 = paVar18->mFaces + s;
    face._0_4_ = (uint)ppaVar2;
    paVar42->mNumIndices = (uint)face;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = ppaVar2;
    uVar26 = SUB168(auVar10 * ZEXT816(4),0);
    if (SUB168(auVar10 * ZEXT816(4),8) != 0) {
      uVar26 = 0xffffffffffffffff;
    }
    puVar27 = (uint *)operator_new__(uVar26);
    paVar42->mIndices = puVar27;
    for (targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage < ppaVar2;
        targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      paVar42->mIndices
      [(long)targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage] = (uint)a_2;
      a_2 = a_2 + 1;
    }
  }
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::vector
            ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
             &targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_1c8);
  it._M_node._4_4_ = 0;
  local_1d8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
       ::begin(&pParser->mControllerLibrary);
  do {
    c = (Controller *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>_>
        ::end(&pParser->mControllerLibrary);
    bVar15 = std::operator!=(&local_1d8,(_Self *)&c);
    if (!bVar15) {
      sVar21 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                         ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                          &targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      if (sVar21 != 0) {
        sVar21 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)local_1c8);
        sVar30 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                           ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                            &targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
        if (sVar21 == sVar30) {
          std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::vector
                    ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)local_2b0);
          for (targetMesh_1._4_4_ = 0; uVar26 = (ulong)targetMesh_1._4_4_,
              sVar21 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::size
                                 ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                                  &targetWeights.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage),
              uVar26 < sVar21; targetMesh_1._4_4_ = targetMesh_1._4_4_ + 1) {
            ppaVar31 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::at
                                 ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                                  &targetWeights.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                                  (ulong)targetMesh_1._4_4_);
            animMesh = (aiAnimMesh *)*ppaVar31;
            _i_3 = aiCreateAnimMesh((aiMesh *)animMesh);
            pvVar32 = std::vector<float,_std::allocator<float>_>::operator[]
                                ((vector<float,_std::allocator<float>_> *)local_1c8,
                                 (ulong)targetMesh_1._4_4_);
            jointNamesAcc._4_4_ = *pvVar32;
            local_93c = jointNamesAcc._4_4_;
            if ((jointNamesAcc._4_4_ == 0.0) && (!NAN(jointNamesAcc._4_4_))) {
              local_93c = 1.0;
            }
            _i_3->mWeight = local_93c;
            aiString::operator=(&_i_3->mName,(aiString *)((animMesh->mName).data + 0xe8));
            std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::push_back
                      ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)local_2b0,
                       (value_type *)&i_3);
          }
          bVar15 = it._M_node._4_4_ == 1;
          paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
          paVar18->mMethod = bVar15 | 2;
          sVar21 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::size
                             ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)local_2b0);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = sVar21;
          uVar26 = SUB168(auVar11 * ZEXT816(8),0);
          if (SUB168(auVar11 * ZEXT816(8),8) != 0) {
            uVar26 = 0xffffffffffffffff;
          }
          ppaVar33 = (aiAnimMesh **)operator_new__(uVar26);
          paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
          paVar18->mAnimMeshes = ppaVar33;
          sVar21 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::size
                             ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)local_2b0);
          paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
          paVar18->mNumAnimMeshes = (uint)sVar21;
          for (jointNamesAcc._0_4_ = 0; uVar26 = (ulong)(uint)jointNamesAcc,
              sVar21 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::size
                                 ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)local_2b0),
              uVar26 < sVar21; jointNamesAcc._0_4_ = (uint)jointNamesAcc + 1) {
            ppaVar34 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::at
                                 ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)local_2b0,
                                  (ulong)(uint)jointNamesAcc);
            paVar3 = *ppaVar34;
            paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
            paVar18->mAnimMeshes[(uint)jointNamesAcc] = paVar3;
          }
          std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::~vector
                    ((vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> *)local_2b0);
        }
      }
      if ((pSrcController != (Controller *)0x0) && (pSrcController->mType == Skin)) {
        jointNames = (Data *)ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                       (pParser,&pParser->mAccessorLibrary,
                                        &pSrcController->mJointNameSource);
        jointMatrixAcc =
             (Accessor *)
             ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                       (pParser,&pParser->mDataLibrary,&((Accessor *)jointNames)->mSource);
        jointMatrices =
             (Data *)ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                               (pParser,&pParser->mAccessorLibrary,
                                &pSrcController->mJointOffsetMatrixSource);
        weightNamesAcc =
             (Accessor *)
             ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                       (pParser,&pParser->mDataLibrary,&((Accessor *)jointMatrices)->mSource);
        local_2f8 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                              (pParser,&pParser->mAccessorLibrary,
                               &(pSrcController->mWeightInputJoints).mAccessor);
        if (local_2f8 != (Accessor *)jointNames) {
          weightsAcc._6_1_ = 1;
          pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_318,
                     "Temporary implementational laziness. If you read this, please report to the author."
                     ,(allocator<char> *)((long)&weightsAcc + 7));
          DeadlyImportError::DeadlyImportError(pDVar35,&local_318);
          weightsAcc._6_1_ = 0;
          __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        weights = (Data *)ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                    (pParser,&pParser->mAccessorLibrary,
                                     &(pSrcController->mWeightInputWeights).mAccessor);
        local_330 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                              (pParser,&pParser->mDataLibrary,&((Accessor *)weights)->mSource);
        if ((((jointMatrixAcc->mCount & 1) == 0) || ((weightNamesAcc->mCount & 1) != 0)) ||
           ((local_330->mIsStringArray & 1U) != 0)) {
          local_352 = 1;
          pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_350,"Data type mismatch while resolving mesh joints",
                     &local_351);
          DeadlyImportError::DeadlyImportError(pDVar35,&local_350);
          local_352 = 0;
          __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        if (((pSrcController->mWeightInputJoints).mOffset != 0) ||
           ((pSrcController->mWeightInputWeights).mOffset != 1)) {
          numBones._6_1_ = 1;
          pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_378,"Unsupported vertex_weight addressing scheme. ",
                     (allocator<char> *)((long)&numBones + 7));
          DeadlyImportError::DeadlyImportError(pDVar35,&local_378);
          numBones._6_1_ = 0;
          __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        __n = (pointer)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(&jointMatrixAcc->mParams);
        this_00 = (allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                  ((long)&weightStartPerVertex.
                          super__Vector_base<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
        dstBones.
        super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = __n;
        std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::allocator
                  (this_00);
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                  *)local_3a0,(size_type)__n,this_00);
        std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>::~allocator
                  ((allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_> *)
                   ((long)&weightStartPerVertex.
                           super__Vector_base<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        std::
        vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
        ::vector((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                  *)local_3c0);
        sVar21 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           (&pSrcController->mWeightCounts);
        pit = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::end(&pSrcController->mWeights);
        std::
        vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
        ::resize((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                  *)local_3c0,sVar21,&pit);
        a_3 = (size_t)std::
                      vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      ::begin(&pSrcController->mWeights);
        for (a_4 = 0; sVar21 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                         (&pSrcController->mWeightCounts), a_4 < sVar21;
            a_4 = a_4 + 1) {
          pvVar36 = std::
                    vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                                  *)local_3c0,a_4);
          pvVar36->_M_current = (pair<unsigned_long,_unsigned_long> *)a_3;
          pvVar25 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&pSrcController->mWeightCounts,a_4);
          __gnu_cxx::
          __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::operator+=((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                        *)&a_3,*pvVar25);
        }
        for (orgIndex = (size_t)dstMesh._M_t.
                                super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
            orgIndex <
            (long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + local_58;
            orgIndex = orgIndex + 1) {
          pvVar25 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&pSrcMesh->mFacePosIndices,orgIndex);
          iit._M_current = (pair<unsigned_long,_unsigned_long> *)*pvVar25;
          pvVar36 = std::
                    vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                    ::operator[]((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                                  *)local_3c0,(size_type)iit._M_current);
          pairCount = (size_t)pvVar36->_M_current;
          pvVar25 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&pSrcController->mWeightCounts,(size_type)iit._M_current);
          uVar26 = *pvVar25;
          jointIndex = 0;
          while (jointIndex < uVar26) {
            ppVar37 = __gnu_cxx::
                      __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                      ::operator->((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                    *)&pairCount);
            sVar21 = ppVar37->first;
            ppVar37 = __gnu_cxx::
                      __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                      ::operator->((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                                    *)&pairCount);
            unique0x00012000 = ppVar37->second;
            w.mVertexId = 0x3f800000;
            bVar15 = std::vector<float,_std::allocator<float>_>::empty(&local_330->mValues);
            if (!bVar15) {
              w.mVertexId = (uint)ReadFloat(this,(Accessor *)weights,local_330,
                                            stack0xfffffffffffffbf0,0);
            }
            if (0.0 < (float)w.mVertexId) {
              aiVertexWeight::aiVertexWeight((aiVertexWeight *)((long)&numRemainingBones + 4));
              numRemainingBones._4_4_ =
                   (int)orgIndex -
                   (int)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                        _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
              local_418 = w.mVertexId;
              pvVar38 = std::
                        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                        ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                      *)local_3a0,sVar21);
              std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                        (pvVar38,(aiVertexWeight *)((long)&numRemainingBones + 4));
            }
            jointIndex = jointIndex + 1;
            __gnu_cxx::
            __normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::operator++((__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
                          *)&pairCount);
          }
        }
        it_1._M_current = (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)0x0;
        local_438._M_current =
             (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
             std::
             vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
             ::begin((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      *)local_3a0);
        __gnu_cxx::
        __normal_iterator<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>const*,std::vector<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>,std::allocator<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>>>>
        ::__normal_iterator<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>*>
                  ((__normal_iterator<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>const*,std::vector<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>,std::allocator<std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>>>>
                    *)&local_430,&local_438);
        while( true ) {
          boneCount = (size_t)std::
                              vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                              ::end((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                     *)local_3a0);
          bVar15 = __gnu_cxx::operator!=
                             (&local_430,
                              (__normal_iterator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_*,_std::vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                               *)&boneCount);
          if (!bVar15) break;
          this_01 = __gnu_cxx::
                    __normal_iterator<const_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_*,_std::vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
                    ::operator->(&local_430);
          sVar21 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(this_01);
          if (sVar21 != 0) {
            it_1._M_current =
                 (vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)
                 ((long)&((it_1._M_current)->
                         super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                         _M_impl.super__Vector_impl_data._M_start + 1);
          }
          __gnu_cxx::
          __normal_iterator<const_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_*,_std::vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>_>
          ::operator++(&local_430);
        }
        uVar1 = (uint)it_1._M_current;
        paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
        paVar18->mNumBones = uVar1;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = it_1._M_current;
        uVar26 = SUB168(auVar12 * ZEXT816(8),0);
        if (SUB168(auVar12 * ZEXT816(8),8) != 0) {
          uVar26 = 0xffffffffffffffff;
        }
        ppaVar39 = (aiBone **)operator_new__(uVar26);
        paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
        paVar18->mBones = ppaVar39;
        a_5 = 0;
        for (bone = (aiBone *)0x0;
            bone < dstBones.
                   super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
            bone = (aiBone *)((long)&(bone->mName).length + 1)) {
          pvVar38 = std::
                    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                    ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                  *)local_3a0,(size_type)bone);
          bVar15 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::empty(pvVar38);
          if (!bVar15) {
            this_02 = (aiBone *)operator_new(0x460);
            aiBone::aiBone(this_02);
            pString = ReadString_abi_cxx11_
                                (this,(Accessor *)jointNames,(Data *)jointMatrixAcc,(size_t)bone);
            aiString::operator=((aiString *)this_02,pString);
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,0)
            ;
            (this_02->mOffsetMatrix).a1 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,1)
            ;
            (this_02->mOffsetMatrix).a2 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,2)
            ;
            (this_02->mOffsetMatrix).a3 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,3)
            ;
            (this_02->mOffsetMatrix).a4 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,4)
            ;
            (this_02->mOffsetMatrix).b1 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,5)
            ;
            (this_02->mOffsetMatrix).b2 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,6)
            ;
            (this_02->mOffsetMatrix).b3 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,7)
            ;
            (this_02->mOffsetMatrix).b4 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,8)
            ;
            (this_02->mOffsetMatrix).c1 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,9)
            ;
            (this_02->mOffsetMatrix).c2 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,10
                              );
            (this_02->mOffsetMatrix).c3 = aVar43;
            aVar43 = ReadFloat(this,(Accessor *)jointMatrices,(Data *)weightNamesAcc,(size_t)bone,
                               0xb);
            (this_02->mOffsetMatrix).c4 = aVar43;
            pvVar38 = std::
                      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                    *)local_3a0,(size_type)bone);
            sVar21 = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::size(pvVar38);
            this_02->mNumWeights = (uint)sVar21;
            uVar26 = (ulong)this_02->mNumWeights;
            paVar40 = (aiVertexWeight *)operator_new__(uVar26 << 3);
            if (uVar26 != 0) {
              local_a70 = paVar40;
              do {
                aiVertexWeight::aiVertexWeight(local_a70);
                local_a70 = local_a70 + 1;
              } while (local_a70 != paVar40 + uVar26);
            }
            this_02->mWeights = paVar40;
            pvVar38 = std::
                      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                    *)local_3a0,(size_type)bone);
            __first = std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::begin(pvVar38);
            pvVar38 = std::
                      vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                      ::operator[]((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                    *)local_3a0,(size_type)bone);
            bindShapeMatrix._56_8_ =
                 std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::end(pvVar38);
            std::
            copy<__gnu_cxx::__normal_iterator<aiVertexWeight*,std::vector<aiVertexWeight,std::allocator<aiVertexWeight>>>,aiVertexWeight*>
                      ((__normal_iterator<aiVertexWeight_*,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>
                        )__first._M_current,
                       (__normal_iterator<aiVertexWeight_*,_std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>
                        )bindShapeMatrix._56_8_,this_02->mWeights);
            aiMatrix4x4t<float>::aiMatrix4x4t((aiMatrix4x4t<float> *)&bnode);
            bnode._0_4_ = pSrcController->mBindShapeMatrix[0];
            bnode._4_4_ = pSrcController->mBindShapeMatrix[1];
            bindShapeMatrix.a1 = pSrcController->mBindShapeMatrix[2];
            bindShapeMatrix.a2 = pSrcController->mBindShapeMatrix[3];
            bindShapeMatrix.a3 = pSrcController->mBindShapeMatrix[4];
            bindShapeMatrix.a4 = pSrcController->mBindShapeMatrix[5];
            bindShapeMatrix.b1 = pSrcController->mBindShapeMatrix[6];
            bindShapeMatrix.b2 = pSrcController->mBindShapeMatrix[7];
            bindShapeMatrix.b3 = pSrcController->mBindShapeMatrix[8];
            bindShapeMatrix.b4 = pSrcController->mBindShapeMatrix[9];
            bindShapeMatrix.c1 = pSrcController->mBindShapeMatrix[10];
            bindShapeMatrix.c2 = pSrcController->mBindShapeMatrix[0xb];
            bindShapeMatrix.c3 = pSrcController->mBindShapeMatrix[0xc];
            bindShapeMatrix.c4 = pSrcController->mBindShapeMatrix[0xd];
            bindShapeMatrix.d1 = pSrcController->mBindShapeMatrix[0xe];
            bindShapeMatrix.d2 = pSrcController->mBindShapeMatrix[0xf];
            aiMatrix4x4t<float>::operator*=(&this_02->mOffsetMatrix,(aiMatrix4x4t<float> *)&bnode);
            pNVar41 = pParser->mRootNode;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4d0,(this_02->mName).data,&local_4d1);
            pNVar41 = FindNode(this,pNVar41,&local_4d0);
            std::__cxx11::string::~string((string *)&local_4d0);
            std::allocator<char>::~allocator(&local_4d1);
            local_4b0 = pNVar41;
            if (pNVar41 == (Node *)0x0) {
              pNVar41 = pParser->mRootNode;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4f8,(this_02->mName).data,&local_4f9);
              local_4b0 = FindNodeBySID(this,pNVar41,&local_4f8);
              std::__cxx11::string::~string((string *)&local_4f8);
              std::allocator<char>::~allocator(&local_4f9);
            }
            if (local_4b0 == (Node *)0x0) {
              this_03 = DefaultLogger::get();
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              basic_formatter<char[75]>
                        (&local_6b8,
                         (char (*) [75])
                         "ColladaLoader::CreateMesh(): could not find corresponding node for joint \""
                        );
              this_04 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                        ::operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                     *)&local_6b8,&(this_02->mName).data);
              this_05 = (basic_formatter *)
                        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                        ::operator_(this_04,(char (*) [3])0xbb58f8);
              Formatter::basic_formatter::operator_cast_to_string(&local_540,this_05);
              Logger::warn(this_03,&local_540);
              std::__cxx11::string::~string((string *)&local_540);
              Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
              ~basic_formatter(&local_6b8);
            }
            else {
              FindNameForNode_abi_cxx11_(&local_520,this,local_4b0);
              aiString::Set((aiString *)this_02,&local_520);
              std::__cxx11::string::~string((string *)&local_520);
            }
            paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::operator->(&local_40);
            paVar18->mBones[a_5] = this_02;
            a_5 = a_5 + 1;
          }
        }
        std::
        vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
        ::~vector((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                   *)local_3c0);
        std::
        vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ::~vector((vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   *)local_3a0);
      }
      paVar18 = std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::release(&local_40);
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_1c8);
      std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::~vector
                ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                 &targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&local_40);
      return paVar18;
    }
    ppVar28 = std::
              _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>
              ::operator->(&local_1d8);
    baseMesh = (Mesh *)&ppVar28->second;
    ppMVar29 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                         (pParser,&pParser->mMeshLibrary,&(ppVar28->second).mMeshId);
    targetAccessor = (Accessor *)*ppMVar29;
    if ((*(int *)&baseMesh->mName == 1) &&
       (_Var16 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)targetAccessor,&pSrcMesh->mName), _Var16)) {
      weightAccessor =
           ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                     (pParser,&pParser->mAccessorLibrary,
                      (string *)
                      &baseMesh->mTexCoords[6].
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
      targetData = (Data *)ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                                     (pParser,&pParser->mAccessorLibrary,(string *)baseMesh->mColors
                                     );
      weightData = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                             (pParser,&pParser->mDataLibrary,&weightAccessor->mSource);
      local_210 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                            (pParser,&pParser->mDataLibrary,(string *)&targetData[1].mStrings);
      it._M_node._4_4_ = *(int *)&(baseMesh->mName).field_0x4;
      if ((weightData->mIsStringArray & 1U) == 0) {
        local_232 = 1;
        pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"target data must contain id. ",&local_231);
        DeadlyImportError::DeadlyImportError(pDVar35,&local_230);
        local_232 = 0;
        __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      if ((local_210->mIsStringArray & 1U) != 0) {
        targetMesh._6_1_ = 1;
        pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&i,"target weight data must not be textual ",
                   (allocator<char> *)((long)&targetMesh + 7));
        DeadlyImportError::DeadlyImportError(pDVar35,(string *)&i);
        targetMesh._6_1_ = 0;
        __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      for (targetMesh._0_4_ = 0; uVar26 = (ulong)(uint)targetMesh,
          sVar21 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(&weightData->mStrings), uVar26 < sVar21;
          targetMesh._0_4_ = (uint)targetMesh + 1) {
        pURL = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&weightData->mStrings,(ulong)(uint)targetMesh);
        ppMVar29 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                             (pParser,&pParser->mMeshLibrary,pURL);
        aimesh = (aiMesh *)*ppMVar29;
        local_270 = findMesh(this,(string *)aimesh);
        if (local_270 == (aiMesh *)0x0) {
          sVar21 = std::vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                   ::size((vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                           *)((aimesh->mName).data + 0x198));
          paVar17 = aimesh;
          if (1 < sVar21) {
            animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
            pDVar35 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&i_1,"Morhing target mesh must be a single",
                       (allocator<char> *)
                       ((long)&animMeshes.
                               super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            DeadlyImportError::DeadlyImportError(pDVar35,(string *)&i_1);
            animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
            __cxa_throw(pDVar35,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          pSubMesh_00 = std::
                        vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                        ::at((vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                              *)((aimesh->mName).data + 0x198),0);
          local_270 = CreateMesh(this,pParser,(Mesh *)paVar17,pSubMesh_00,(Controller *)0x0,0,0);
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                    (&this->mTargetMeshes,&local_270);
        }
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                  ((vector<aiMesh_*,_std::allocator<aiMesh_*>_> *)
                   &targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_270);
      }
      for (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          uVar26 = (ulong)(uint)animMeshes.
                                super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,
          sVar21 = std::vector<float,_std::allocator<float>_>::size(&local_210->mValues),
          uVar26 < sVar21;
          animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        __x = std::vector<float,_std::allocator<float>_>::at
                        (&local_210->mValues,
                         (ulong)(uint)animMeshes.
                                      super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<float,_std::allocator<float>_>::push_back
                  ((vector<float,_std::allocator<float>_> *)local_1c8,__x);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Controller>_>
    ::operator++(&local_1d8);
  } while( true );
}

Assistant:

aiMesh* ColladaLoader::CreateMesh(const ColladaParser& pParser, const Collada::Mesh* pSrcMesh, const Collada::SubMesh& pSubMesh,
    const Collada::Controller* pSrcController, size_t pStartVertex, size_t pStartFace) {
    std::unique_ptr<aiMesh> dstMesh(new aiMesh);

    dstMesh->mName = pSrcMesh->mName;

    // count the vertices addressed by its faces
    const size_t numVertices = std::accumulate(pSrcMesh->mFaceSize.begin() + pStartFace,
        pSrcMesh->mFaceSize.begin() + pStartFace + pSubMesh.mNumFaces, size_t(0));

    // copy positions
    dstMesh->mNumVertices = static_cast<unsigned int>(numVertices);
    dstMesh->mVertices = new aiVector3D[numVertices];
    std::copy(pSrcMesh->mPositions.begin() + pStartVertex, pSrcMesh->mPositions.begin() +
        pStartVertex + numVertices, dstMesh->mVertices);

    // normals, if given. HACK: (thom) Due to the glorious Collada spec we never
    // know if we have the same number of normals as there are positions. So we
    // also ignore any vertex attribute if it has a different count
    if (pSrcMesh->mNormals.size() >= pStartVertex + numVertices) {
        dstMesh->mNormals = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mNormals.begin() + pStartVertex, pSrcMesh->mNormals.begin() +
            pStartVertex + numVertices, dstMesh->mNormals);
    }

    // tangents, if given.
    if (pSrcMesh->mTangents.size() >= pStartVertex + numVertices) {
        dstMesh->mTangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mTangents.begin() + pStartVertex, pSrcMesh->mTangents.begin() +
            pStartVertex + numVertices, dstMesh->mTangents);
    }

    // bitangents, if given.
    if (pSrcMesh->mBitangents.size() >= pStartVertex + numVertices) {
        dstMesh->mBitangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mBitangents.begin() + pStartVertex, pSrcMesh->mBitangents.begin() +
            pStartVertex + numVertices, dstMesh->mBitangents);
    }

    // same for texturecoords, as many as we have
    // empty slots are not allowed, need to pack and adjust UV indexes accordingly
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
        if (pSrcMesh->mTexCoords[a].size() >= pStartVertex + numVertices) {
            dstMesh->mTextureCoords[real] = new aiVector3D[numVertices];
            for (size_t b = 0; b < numVertices; ++b) {
                dstMesh->mTextureCoords[real][b] = pSrcMesh->mTexCoords[a][pStartVertex + b];
            }

            dstMesh->mNumUVComponents[real] = pSrcMesh->mNumUVComponents[a];
            ++real;
        }
    }

    // same for vertex colors, as many as we have. again the same packing to avoid empty slots
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
        if (pSrcMesh->mColors[a].size() >= pStartVertex + numVertices) {
            dstMesh->mColors[real] = new aiColor4D[numVertices];
            std::copy(pSrcMesh->mColors[a].begin() + pStartVertex, pSrcMesh->mColors[a].begin() + pStartVertex + numVertices, dstMesh->mColors[real]);
            ++real;
        }
    }

    // create faces. Due to the fact that each face uses unique vertices, we can simply count up on each vertex
    size_t vertex = 0;
    dstMesh->mNumFaces = static_cast<unsigned int>(pSubMesh.mNumFaces);
    dstMesh->mFaces = new aiFace[dstMesh->mNumFaces];
    for (size_t a = 0; a < dstMesh->mNumFaces; ++a) {
        size_t s = pSrcMesh->mFaceSize[pStartFace + a];
        aiFace& face = dstMesh->mFaces[a];
        face.mNumIndices = static_cast<unsigned int>(s);
        face.mIndices = new unsigned int[s];
        for (size_t b = 0; b < s; ++b) {
            face.mIndices[b] = static_cast<unsigned int>(vertex++);
        }
    }

    // create morph target meshes if any
    std::vector<aiMesh*> targetMeshes;
    std::vector<float> targetWeights;
    Collada::MorphMethod method = Collada::Normalized;

    for (std::map<std::string, Collada::Controller>::const_iterator it = pParser.mControllerLibrary.begin();
        it != pParser.mControllerLibrary.end(); ++it) {
        const Collada::Controller &c = it->second;
        const Collada::Mesh* baseMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, c.mMeshId);

        if (c.mType == Collada::Morph && baseMesh->mName == pSrcMesh->mName) {
            const Collada::Accessor& targetAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphTarget);
            const Collada::Accessor& weightAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphWeight);
            const Collada::Data& targetData = pParser.ResolveLibraryReference(pParser.mDataLibrary, targetAccessor.mSource);
            const Collada::Data& weightData = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightAccessor.mSource);

            // take method
            method = c.mMethod;

            if (!targetData.mIsStringArray) {
                throw DeadlyImportError("target data must contain id. ");
            }
            if (weightData.mIsStringArray) {
                throw DeadlyImportError("target weight data must not be textual ");
            }

            for (unsigned int i = 0; i < targetData.mStrings.size(); ++i) {
                const Collada::Mesh* targetMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, targetData.mStrings.at(i));

                aiMesh *aimesh = findMesh(targetMesh->mName);
                if (!aimesh) {
                    if (targetMesh->mSubMeshes.size() > 1) {
                        throw DeadlyImportError("Morhing target mesh must be a single");
                    }
                    aimesh = CreateMesh(pParser, targetMesh, targetMesh->mSubMeshes.at(0), NULL, 0, 0);
                    mTargetMeshes.push_back(aimesh);
                }
                targetMeshes.push_back(aimesh);
            }
            for (unsigned int i = 0; i < weightData.mValues.size(); ++i) {
                targetWeights.push_back(weightData.mValues.at(i));
            }
        }
    }
    if (targetMeshes.size() > 0 && targetWeights.size() == targetMeshes.size()) {
        std::vector<aiAnimMesh*> animMeshes;
        for (unsigned int i = 0; i < targetMeshes.size(); ++i) {
            aiMesh* targetMesh = targetMeshes.at(i);
            aiAnimMesh *animMesh = aiCreateAnimMesh(targetMesh);
            float weight = targetWeights[i];
            animMesh->mWeight = weight == 0 ? 1.0f : weight;
            animMesh->mName = targetMesh->mName;
            animMeshes.push_back(animMesh);
        }
        dstMesh->mMethod = (method == Collada::Relative)
            ? aiMorphingMethod_MORPH_RELATIVE
            : aiMorphingMethod_MORPH_NORMALIZED;
        dstMesh->mAnimMeshes = new aiAnimMesh*[animMeshes.size()];
        dstMesh->mNumAnimMeshes = static_cast<unsigned int>(animMeshes.size());
        for (unsigned int i = 0; i < animMeshes.size(); ++i) {
            dstMesh->mAnimMeshes[i] = animMeshes.at(i);
        }
    }

    // create bones if given
    if (pSrcController && pSrcController->mType == Collada::Skin) {
        // resolve references - joint names
        const Collada::Accessor& jointNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointNameSource);
        const Collada::Data& jointNames = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointNamesAcc.mSource);
        // joint offset matrices
        const Collada::Accessor& jointMatrixAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointOffsetMatrixSource);
        const Collada::Data& jointMatrices = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointMatrixAcc.mSource);
        // joint vertex_weight name list - should refer to the same list as the joint names above. If not, report and reconsider
        const Collada::Accessor& weightNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputJoints.mAccessor);
        if (&weightNamesAcc != &jointNamesAcc)
            throw DeadlyImportError("Temporary implementational laziness. If you read this, please report to the author.");
        // vertex weights
        const Collada::Accessor& weightsAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputWeights.mAccessor);
        const Collada::Data& weights = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightsAcc.mSource);

        if (!jointNames.mIsStringArray || jointMatrices.mIsStringArray || weights.mIsStringArray)
            throw DeadlyImportError("Data type mismatch while resolving mesh joints");
        // sanity check: we rely on the vertex weights always coming as pairs of BoneIndex-WeightIndex
        if (pSrcController->mWeightInputJoints.mOffset != 0 || pSrcController->mWeightInputWeights.mOffset != 1)
            throw DeadlyImportError("Unsupported vertex_weight addressing scheme. ");

        // create containers to collect the weights for each bone
        size_t numBones = jointNames.mStrings.size();
        std::vector<std::vector<aiVertexWeight> > dstBones(numBones);

        // build a temporary array of pointers to the start of each vertex's weights
        typedef std::vector< std::pair<size_t, size_t> > IndexPairVector;
        std::vector<IndexPairVector::const_iterator> weightStartPerVertex;
        weightStartPerVertex.resize(pSrcController->mWeightCounts.size(), pSrcController->mWeights.end());

        IndexPairVector::const_iterator pit = pSrcController->mWeights.begin();
        for (size_t a = 0; a < pSrcController->mWeightCounts.size(); ++a) {
            weightStartPerVertex[a] = pit;
            pit += pSrcController->mWeightCounts[a];
        }

        // now for each vertex put the corresponding vertex weights into each bone's weight collection
        for (size_t a = pStartVertex; a < pStartVertex + numVertices; ++a) {
            // which position index was responsible for this vertex? that's also the index by which
            // the controller assigns the vertex weights
            size_t orgIndex = pSrcMesh->mFacePosIndices[a];
            // find the vertex weights for this vertex
            IndexPairVector::const_iterator iit = weightStartPerVertex[orgIndex];
            size_t pairCount = pSrcController->mWeightCounts[orgIndex];


            for( size_t b = 0; b < pairCount; ++b, ++iit) {
                const size_t jointIndex = iit->first;
                const size_t vertexIndex = iit->second;                
                ai_real weight = 1.0f;
                if (!weights.mValues.empty()) {
                    weight = ReadFloat(weightsAcc, weights, vertexIndex, 0);
                }

                // one day I gonna kill that XSI Collada exporter
                if (weight > 0.0f)
                {
                    aiVertexWeight w;
                    w.mVertexId = static_cast<unsigned int>(a - pStartVertex);
                    w.mWeight = weight;
                    dstBones[jointIndex].push_back(w);
                }
            }
        }

        // count the number of bones which influence vertices of the current submesh
        size_t numRemainingBones = 0;
        for( std::vector<std::vector<aiVertexWeight> >::const_iterator it = dstBones.begin(); it != dstBones.end(); ++it) {
            if( it->size() > 0) {
                ++numRemainingBones;
            }
        }

        // create bone array and copy bone weights one by one
        dstMesh->mNumBones = static_cast<unsigned int>(numRemainingBones);
        dstMesh->mBones = new aiBone*[numRemainingBones];
        size_t boneCount = 0;
        for( size_t a = 0; a < numBones; ++a) {
            // omit bones without weights
            if( dstBones[a].empty() ) {
                continue;
            }

            // create bone with its weights
            aiBone* bone = new aiBone;
            bone->mName = ReadString(jointNamesAcc, jointNames, a);
            bone->mOffsetMatrix.a1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 0);
            bone->mOffsetMatrix.a2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 1);
            bone->mOffsetMatrix.a3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 2);
            bone->mOffsetMatrix.a4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 3);
            bone->mOffsetMatrix.b1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 4);
            bone->mOffsetMatrix.b2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 5);
            bone->mOffsetMatrix.b3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 6);
            bone->mOffsetMatrix.b4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 7);
            bone->mOffsetMatrix.c1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 8);
            bone->mOffsetMatrix.c2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 9);
            bone->mOffsetMatrix.c3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 10);
            bone->mOffsetMatrix.c4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 11);
            bone->mNumWeights = static_cast<unsigned int>(dstBones[a].size());
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            std::copy(dstBones[a].begin(), dstBones[a].end(), bone->mWeights);

            // apply bind shape matrix to offset matrix
            aiMatrix4x4 bindShapeMatrix;
            bindShapeMatrix.a1 = pSrcController->mBindShapeMatrix[0];
            bindShapeMatrix.a2 = pSrcController->mBindShapeMatrix[1];
            bindShapeMatrix.a3 = pSrcController->mBindShapeMatrix[2];
            bindShapeMatrix.a4 = pSrcController->mBindShapeMatrix[3];
            bindShapeMatrix.b1 = pSrcController->mBindShapeMatrix[4];
            bindShapeMatrix.b2 = pSrcController->mBindShapeMatrix[5];
            bindShapeMatrix.b3 = pSrcController->mBindShapeMatrix[6];
            bindShapeMatrix.b4 = pSrcController->mBindShapeMatrix[7];
            bindShapeMatrix.c1 = pSrcController->mBindShapeMatrix[8];
            bindShapeMatrix.c2 = pSrcController->mBindShapeMatrix[9];
            bindShapeMatrix.c3 = pSrcController->mBindShapeMatrix[10];
            bindShapeMatrix.c4 = pSrcController->mBindShapeMatrix[11];
            bindShapeMatrix.d1 = pSrcController->mBindShapeMatrix[12];
            bindShapeMatrix.d2 = pSrcController->mBindShapeMatrix[13];
            bindShapeMatrix.d3 = pSrcController->mBindShapeMatrix[14];
            bindShapeMatrix.d4 = pSrcController->mBindShapeMatrix[15];
            bone->mOffsetMatrix *= bindShapeMatrix;

            // HACK: (thom) Some exporters address the bone nodes by SID, others address them by ID or even name.
            // Therefore I added a little name replacement here: I search for the bone's node by either name, ID or SID,
            // and replace the bone's name by the node's name so that the user can use the standard
            // find-by-name method to associate nodes with bones.
            const Collada::Node* bnode = FindNode( pParser.mRootNode, bone->mName.data);
            if( !bnode) {
                bnode = FindNodeBySID( pParser.mRootNode, bone->mName.data);
            }

            // assign the name that we would have assigned for the source node
            if( bnode) {
                bone->mName.Set( FindNameForNode( bnode));
            } else {
                ASSIMP_LOG_WARN_F( "ColladaLoader::CreateMesh(): could not find corresponding node for joint \"", bone->mName.data, "\"." );
            }

            // and insert bone
            dstMesh->mBones[boneCount++] = bone;
        }
    }

    return dstMesh.release();
}